

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void set_txfm_ctxs(TX_SIZE tx_size,int n4_w,int n4_h,int skip,MACROBLOCKD *xd)

{
  uint8_t txs;
  uint8_t txs_00;
  undefined7 in_register_00000039;
  ulong uVar1;
  
  uVar1 = (ulong)(uint)((int)CONCAT71(in_register_00000039,tx_size) << 2);
  txs = (char)n4_w * '\x04';
  if (skip == 0) {
    txs = (uint8_t)*(undefined4 *)((long)tx_size_wide + uVar1);
  }
  txs_00 = (char)n4_h * '\x04';
  if (skip == 0) {
    txs_00 = (uint8_t)*(undefined4 *)((long)tx_size_high + uVar1);
  }
  set_txfm_ctx(xd->above_txfm_context,txs,n4_w);
  set_txfm_ctx(xd->left_txfm_context,txs_00,n4_h);
  return;
}

Assistant:

static inline void set_txfm_ctxs(TX_SIZE tx_size, int n4_w, int n4_h, int skip,
                                 const MACROBLOCKD *xd) {
  uint8_t bw = tx_size_wide[tx_size];
  uint8_t bh = tx_size_high[tx_size];

  if (skip) {
    bw = n4_w * MI_SIZE;
    bh = n4_h * MI_SIZE;
  }

  set_txfm_ctx(xd->above_txfm_context, bw, n4_w);
  set_txfm_ctx(xd->left_txfm_context, bh, n4_h);
}